

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockData.cpp
# Opt level: O2

SockData * AGSSock::SockData_Create(ags_t size,ags_t byte)

{
  SockData *this;
  
  this = (SockData *)operator_new(0x20);
  SockData::SockData(this,size,(char)byte);
  (**(code **)(*AGSSockAPI::engine + 0x220))(AGSSockAPI::engine,this,&agsSockData);
  return this;
}

Assistant:

SockData *SockData_Create(ags_t size, ags_t byte)
{
	SockData *data = new SockData(size, byte);
	AGS_OBJECT(SockData, data);
	return data;
}